

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_57b0f5::TransformSelector::~TransformSelector(TransformSelector *this)

{
  this->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_005be050;
  std::__cxx11::string::~string((string *)&this->Tag);
  return;
}

Assistant:

virtual ~TransformSelector() = default;